

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftutil.c
# Opt level: O2

FT_Int ft_mem_strcpyn(char *dst,char *src,FT_ULong size)

{
  long lVar1;
  
  lVar1 = 0;
  for (; 1 < size; size = size - 1) {
    if (src[lVar1] == '\0') break;
    dst[lVar1] = src[lVar1];
    lVar1 = lVar1 + 1;
  }
  dst[lVar1] = '\0';
  return (FT_Int)(src[lVar1] != '\0');
}

Assistant:

FT_BASE_DEF( FT_Int )
  ft_mem_strcpyn( char*        dst,
                  const char*  src,
                  FT_ULong     size )
  {
    while ( size > 1 && *src != 0 )
    {
      *dst++ = *src++;
      size--;
    }

    *dst = 0;  /* always zero-terminate */

    return *src != 0;
  }